

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptInterpreter.cpp
# Opt level: O0

void __thiscall MiniScript::Interpreter::Interpreter(Interpreter *this,String *source)

{
  String local_28;
  String *local_18;
  String *source_local;
  Interpreter *this_local;
  
  this->_vptr_Interpreter = (_func_int **)&PTR_ReportError_00197628;
  this->standardOutput = (TextOutputMethod)0x0;
  this->implicitOutput = (TextOutputMethod)0x0;
  this->errorOutput = (TextOutputMethod)0x0;
  this->hostData = (void *)0x0;
  this->vm = (Machine *)0x0;
  local_18 = source;
  source_local = (String *)this;
  String::String(&this->source);
  this->parser = (Parser *)0x0;
  String::String(&local_28,source);
  Reset(this,&local_28);
  String::~String(&local_28);
  return;
}

Assistant:

Interpreter::Interpreter(String source) : standardOutput(nullptr), errorOutput(nullptr), implicitOutput(nullptr),
	parser(nullptr), vm(nullptr), hostData(nullptr) {
		Reset(source);
	}